

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::GetBooleanValue(cmConditionEvaluator *this,cmExpandedCommandArgument *arg)

{
  __type _Var1;
  bool bVar2;
  char *val;
  double dVar3;
  char *end;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"0",&local_41);
  _Var1 = std::operator==(&arg->Value,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!_Var1) {
    std::__cxx11::string::string((string *)&local_40,"1",&local_41);
    _Var1 = std::operator==(&arg->Value,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (_Var1) {
      return true;
    }
    bVar2 = cmSystemTools::IsOn((arg->Value)._M_dataplus._M_p);
    if (bVar2) {
      return true;
    }
    bVar2 = cmSystemTools::IsOff((arg->Value)._M_dataplus._M_p);
    if (!bVar2) {
      if (((arg->Value)._M_string_length != 0) &&
         (dVar3 = strtod((arg->Value)._M_dataplus._M_p,(char **)&local_40),
         *local_40._M_dataplus._M_p == '\0')) {
        return (bool)(-(dVar3 != 0.0) & 1);
      }
      val = GetDefinitionIfUnquoted(this,arg);
      bVar2 = cmSystemTools::IsOff(val);
      return !bVar2;
    }
  }
  return false;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValue(
  cmExpandedCommandArgument& arg) const
{
  // Check basic constants.
  if (arg == "0")
    {
    return false;
    }
  if (arg == "1")
    {
    return true;
    }

  // Check named constants.
  if (cmSystemTools::IsOn(arg.c_str()))
    {
    return true;
    }
  if (cmSystemTools::IsOff(arg.c_str()))
    {
    return false;
    }

  // Check for numbers.
  if(!arg.empty())
    {
    char* end;
    double d = strtod(arg.c_str(), &end);
    if(*end == '\0')
      {
      // The whole string is a number.  Use C conversion to bool.
      return d? true:false;
      }
    }

  // Check definition.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  return !cmSystemTools::IsOff(def);
}